

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,StringPtr *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
                 ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4)

{
  char *pcVar1;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_00;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  char *end;
  char *i;
  ArrayPtr<const_char> *rest_local_3;
  ArrayPtr<const_char> *rest_local_2;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  StringPtr *first_local;
  char *target_local;
  
  end = StringPtr::begin(first);
  pcVar1 = StringPtr::end(first);
  first_local = (StringPtr *)target;
  while (end != pcVar1) {
    *(char *)&(first_local->content).ptr = *end;
    end = end + 1;
    first_local = (StringPtr *)((long)&(first_local->content).ptr + 1);
  }
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_00 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pcVar1 = fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     ((char *)first_local,first_00,rest_00,rest_1_00,rest_2_00,rest_3_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}